

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O2

optional<wasm::WATParser::(anonymous_namespace)::LexResult> * __thiscall
wasm::WATParser::anon_unknown_10::spacechar
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          anon_unknown_10 *this,string_view in)

{
  bool bVar1;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  undefined1 local_28 [8];
  LexCtx ctx;
  
  ctx.input._M_len = in._M_len;
  ctx.input._M_str = (char *)0x0;
  sv._M_str = " ";
  sv._M_len = 1;
  local_28 = (undefined1  [8])this;
  bVar1 = LexCtx::takePrefix((LexCtx *)local_28,sv);
  if (!bVar1) {
    sv_00._M_str = "\n";
    sv_00._M_len = 1;
    bVar1 = LexCtx::takePrefix((LexCtx *)local_28,sv_00);
    if (!bVar1) {
      sv_01._M_str = "\r";
      sv_01._M_len = 1;
      bVar1 = LexCtx::takePrefix((LexCtx *)local_28,sv_01);
      if (!bVar1) {
        sv_02._M_str = "\t";
        sv_02._M_len = 1;
        LexCtx::takePrefix((LexCtx *)local_28,sv_02);
      }
    }
  }
  LexCtx::lexed(__return_storage_ptr__,(LexCtx *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexResult> spacechar(std::string_view in) {
  LexCtx ctx(in);
  ctx.takePrefix(" "sv) || ctx.takePrefix("\n"sv) || ctx.takePrefix("\r"sv) ||
    ctx.takePrefix("\t"sv);
  return ctx.lexed();
}